

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::ChannelsMerge(ImDrawList *this)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  ImDrawChannel *pIVar4;
  unsigned_short *puVar5;
  ImGuiContext *pIVar6;
  ImDrawCmd *__dest;
  unsigned_short *__dest_00;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ImDrawCmd *pIVar14;
  int iVar15;
  
  if (1 < this->_ChannelsCount) {
    iVar15 = 0;
    ChannelsSetCurrent(this,0);
    uVar2 = (this->CmdBuffer).Size;
    if ((ulong)uVar2 != 0) {
      if ((int)uVar2 < 1) {
LAB_0014bea9:
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                      ,0x35d,"value_type &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
      }
      if ((this->CmdBuffer).Data[(ulong)uVar2 - 1].ElemCount == 0) {
        (this->CmdBuffer).Size = uVar2 - 1;
      }
    }
    iVar3 = this->_ChannelsCount;
    iVar9 = 0;
    if (1 < (long)iVar3) {
      uVar2 = (this->_Channels).Size;
      pIVar4 = (this->_Channels).Data;
      uVar8 = 1;
      if (1 < (int)uVar2) {
        uVar8 = (ulong)uVar2;
      }
      iVar9 = 0;
      lVar10 = 0x20;
      iVar15 = 0;
      do {
        if (uVar8 * 0x20 == lVar10) goto LAB_0014be8a;
        uVar2 = *(uint *)((long)&(pIVar4->CmdBuffer).Size + lVar10);
        if ((ulong)uVar2 != 0) {
          if ((int)uVar2 < 1) goto LAB_0014bea9;
          if (*(int *)(*(long *)((long)&(pIVar4->CmdBuffer).Data + lVar10) + -0x30 +
                      (ulong)uVar2 * 0x30) == 0) {
            *(uint *)((long)&(pIVar4->CmdBuffer).Size + lVar10) = uVar2 - 1;
          }
        }
        iVar9 = iVar9 + *(int *)((long)&(pIVar4->CmdBuffer).Size + lVar10);
        iVar15 = iVar15 + *(int *)((long)&(pIVar4->IdxBuffer).Size + lVar10);
        lVar10 = lVar10 + 0x20;
      } while ((long)iVar3 * 0x20 != lVar10);
    }
    pIVar6 = GImGui;
    iVar11 = (this->CmdBuffer).Size + iVar9;
    iVar3 = (this->CmdBuffer).Capacity;
    if (iVar3 < iVar11) {
      if (iVar3 == 0) {
        iVar12 = 8;
      }
      else {
        iVar12 = iVar3 / 2 + iVar3;
      }
      if (iVar12 <= iVar11) {
        iVar12 = iVar11;
      }
      if (iVar3 < iVar12) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        __dest = (ImDrawCmd *)(*(pIVar6->IO).MemAllocFn)((long)iVar12 * 0x30);
        pIVar14 = (this->CmdBuffer).Data;
        if (pIVar14 != (ImDrawCmd *)0x0) {
          memcpy(__dest,pIVar14,(long)(this->CmdBuffer).Size * 0x30);
        }
        pIVar14 = (this->CmdBuffer).Data;
        if (pIVar14 != (ImDrawCmd *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar14);
        (this->CmdBuffer).Data = __dest;
        (this->CmdBuffer).Capacity = iVar12;
      }
    }
    (this->CmdBuffer).Size = iVar11;
    pIVar6 = GImGui;
    lVar10 = (long)(this->IdxBuffer).Size + (long)iVar15;
    iVar3 = (this->IdxBuffer).Capacity;
    iVar11 = (int)lVar10;
    if (iVar3 < iVar11) {
      if (iVar3 == 0) {
        iVar12 = 8;
      }
      else {
        iVar12 = iVar3 / 2 + iVar3;
      }
      if (iVar12 <= iVar11) {
        iVar12 = iVar11;
      }
      if (iVar3 < iVar12) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        __dest_00 = (unsigned_short *)(*(pIVar6->IO).MemAllocFn)((long)iVar12 * 2);
        puVar5 = (this->IdxBuffer).Data;
        if (puVar5 != (unsigned_short *)0x0) {
          memcpy(__dest_00,puVar5,(long)(this->IdxBuffer).Size * 2);
        }
        puVar5 = (this->IdxBuffer).Data;
        if (puVar5 != (unsigned_short *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(puVar5);
        (this->IdxBuffer).Data = __dest_00;
        (this->IdxBuffer).Capacity = iVar12;
      }
    }
    (this->IdxBuffer).Size = iVar11;
    pIVar14 = (this->CmdBuffer).Data;
    iVar3 = (this->CmdBuffer).Size;
    this->_IdxWritePtr = (this->IdxBuffer).Data + (lVar10 - iVar15);
    if (1 < this->_ChannelsCount) {
      pIVar14 = pIVar14 + ((long)iVar3 - (long)iVar9);
      lVar10 = 1;
      lVar13 = 0x38;
      do {
        if ((this->_Channels).Size <= lVar10) {
LAB_0014be8a:
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                        ,0x353,
                        "value_type &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
        }
        pIVar4 = (this->_Channels).Data;
        lVar7 = (long)*(int *)((long)pIVar4 + lVar13 + -0x18);
        if (lVar7 != 0) {
          memcpy(pIVar14,*(void **)((long)pIVar4 + lVar13 + -0x10),lVar7 * 0x30);
          pIVar14 = pIVar14 + lVar7;
        }
        lVar7 = (long)*(int *)((long)pIVar4 + lVar13 + -8);
        if (lVar7 != 0) {
          memcpy(this->_IdxWritePtr,*(void **)((long)&(pIVar4->CmdBuffer).Size + lVar13),lVar7 * 2);
          this->_IdxWritePtr = this->_IdxWritePtr + lVar7;
        }
        lVar10 = lVar10 + 1;
        lVar13 = lVar13 + 0x20;
      } while (lVar10 < this->_ChannelsCount);
    }
    AddDrawCmd(this);
    this->_ChannelsCount = 1;
  }
  return;
}

Assistant:

void ImDrawList::ChannelsMerge()
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_ChannelsCount <= 1)
        return;

    ChannelsSetCurrent(0);
    if (CmdBuffer.Size && CmdBuffer.back().ElemCount == 0)
        CmdBuffer.pop_back();

    int new_cmd_buffer_count = 0, new_idx_buffer_count = 0;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch.CmdBuffer.Size && ch.CmdBuffer.back().ElemCount == 0)
            ch.CmdBuffer.pop_back();
        new_cmd_buffer_count += ch.CmdBuffer.Size;
        new_idx_buffer_count += ch.IdxBuffer.Size;
    }
    CmdBuffer.resize(CmdBuffer.Size + new_cmd_buffer_count);
    IdxBuffer.resize(IdxBuffer.Size + new_idx_buffer_count);

    ImDrawCmd* cmd_write = CmdBuffer.Data + CmdBuffer.Size - new_cmd_buffer_count;
    _IdxWritePtr = IdxBuffer.Data + IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch.CmdBuffer.Size) { memcpy(cmd_write, ch.CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch.IdxBuffer.Size) { memcpy(_IdxWritePtr, ch.IdxBuffer.Data, sz * sizeof(ImDrawIdx)); _IdxWritePtr += sz; }
    }
    AddDrawCmd();
    _ChannelsCount = 1;
}